

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

uint64_t quicly_determine_packet_number(uint32_t truncated,size_t num_bits,uint64_t expected)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 1L << ((byte)num_bits & 0x3f);
  uVar1 = (ulong)truncated | -uVar2 & expected;
  if (expected < uVar1 + (uVar2 >> 1)) {
    uVar3 = uVar2;
    if (uVar1 < uVar2) {
      uVar3 = 0;
    }
    if (uVar1 <= (uVar2 >> 1) + expected) {
      uVar3 = 0;
    }
    return uVar1 - uVar3;
  }
  return uVar1 + uVar2;
}

Assistant:

uint64_t quicly_determine_packet_number(uint32_t truncated, size_t num_bits, uint64_t expected)
{
    uint64_t win = (uint64_t)1 << num_bits, candidate = (expected & ~(win - 1)) | truncated;

    if (candidate + win / 2 <= expected)
        return candidate + win;
    if (candidate > expected + win / 2 && candidate >= win)
        return candidate - win;
    return candidate;
}